

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::anon_unknown_14::translateActiveException(void)

{
  pointer ppIVar1;
  int iVar2;
  String *in_RDI;
  pointer ppIVar3;
  String res;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  undefined7 local_28;
  undefined1 uStack_21;
  
  local_38 = 0;
  uStack_21 = 0x17;
  getExceptionTranslators();
  ppIVar1 = getExceptionTranslators::data.
            super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar3 = getExceptionTranslators::data.
                 super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar3 != ppIVar1;
      ppIVar3 = ppIVar3 + 1) {
    iVar2 = (*(*ppIVar3)->_vptr_IExceptionTranslator[2])(*ppIVar3,&local_38);
    if ((char)iVar2 != '\0') goto LAB_001089ad;
  }
  __cxa_rethrow();
LAB_001089ad:
  *(ulong *)((long)&in_RDI->field_0 + 0x10) = CONCAT17(uStack_21,local_28);
  (in_RDI->field_0).data.ptr = (char *)CONCAT71(uStack_37,local_38);
  *(undefined8 *)((long)&in_RDI->field_0 + 8) = uStack_30;
  return in_RDI;
}

Assistant:

String translateActiveException() {
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        String res;
        auto&  translators = getExceptionTranslators();
        for(auto& curr : translators)
            if(curr->translate(res))
                return res;
        // clang-format off
        DOCTEST_GCC_SUPPRESS_WARNING_WITH_PUSH("-Wcatch-value")
        try {
            throw;
        } catch(std::exception& ex) {
            return ex.what();
        } catch(std::string& msg) {
            return msg.c_str();
        } catch(const char* msg) {
            return msg;
        } catch(...) {
            return "unknown exception";
        }
        DOCTEST_GCC_SUPPRESS_WARNING_POP
// clang-format on
#else  // DOCTEST_CONFIG_NO_EXCEPTIONS
        return "";
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
    }